

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

lzma_bool lzma_index_iter_locate(lzma_index_iter *iter,lzma_vli target)

{
  void *pvVar1;
  long lVar2;
  lzma_bool lVar3;
  long *plVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  
  lVar3 = '\x01';
  if (target < ((index_tree *)iter->internal[0].p)[1].root) {
    plVar4 = (long *)index_tree_locate((index_tree *)iter->internal[0].p,target);
    if (plVar4 == (long *)0x0) {
      __assert_fail("stream != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0x4de,"lzma_bool lzma_index_iter_locate(lzma_index_iter *, lzma_vli)");
    }
    lVar2 = *plVar4;
    pvVar5 = index_tree_locate((index_tree *)(plVar4 + 7),target - lVar2);
    if (pvVar5 == (void *)0x0) {
      __assert_fail("group != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0x4e3,"lzma_bool lzma_index_iter_locate(lzma_index_iter *, lzma_vli)");
    }
    pvVar6 = (void *)0x0;
    pvVar1 = *(void **)((long)pvVar5 + 0x38);
    while (pvVar7 = pvVar1, pvVar6 <= pvVar7 && (long)pvVar7 - (long)pvVar6 != 0) {
      uVar8 = (ulong)((long)pvVar7 - (long)pvVar6) >> 1;
      pvVar1 = (void *)(uVar8 + (long)pvVar6);
      if (*(ulong *)((long)pvVar5 + (long)pvVar1 * 0x10 + 0x40) <= target - lVar2) {
        pvVar6 = (void *)((long)pvVar6 + uVar8 + 1);
        pvVar1 = pvVar7;
      }
    }
    iter->internal[1].p = plVar4;
    iter->internal[2].p = pvVar5;
    iter->internal[3].p = pvVar6;
    iter_set_info(iter);
    lVar3 = '\0';
  }
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_bool)
lzma_index_iter_locate(lzma_index_iter *iter, lzma_vli target)
{
	const index_stream *stream;
	const index_group *group;
	size_t left, right;

	const lzma_index *i = iter->internal[ITER_INDEX].p;

	// If the target is past the end of the file, return immediately.
	if (i->uncompressed_size <= target)
		return true;

	// Locate the Stream containing the target offset.
	stream = index_tree_locate(&i->streams, target);
	assert(stream != NULL);
	target -= stream->node.uncompressed_base;

	// Locate the group containing the target offset.
	group = index_tree_locate(&stream->groups, target);
	assert(group != NULL);

	// Use binary search to locate the exact Record. It is the first
	// Record whose uncompressed_sum is greater than target.
	// This is because we want the rightmost Record that fullfills the
	// search criterion. It is possible that there are empty Blocks;
	// we don't want to return them.
	left = 0;
	right = group->last;

	while (left < right) {
		const size_t pos = left + (right - left) / 2;
		if (group->records[pos].uncompressed_sum <= target)
			left = pos + 1;
		else
			right = pos;
	}

	iter->internal[ITER_STREAM].p = stream;
	iter->internal[ITER_GROUP].p = group;
	iter->internal[ITER_RECORD].s = left;

	iter_set_info(iter);

	return false;
}